

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O1

int point_mul_two_id_tc26_gost_3410_2012_512_paramSetC
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  long lVar8;
  uint uVar9;
  pt_prj_t_conflict4 *ppVar10;
  uint64_t *puVar11;
  pt_aff_t_conflict4 *ppVar12;
  limb_t *plVar13;
  pt_prj_t_conflict4 *ppVar14;
  uint64_t *puVar15;
  byte bVar16;
  long lVar17;
  bool bVar18;
  byte bVar19;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  uchar b_n [64];
  pt_aff_t_conflict4 P;
  int8_t bnaf [513];
  int8_t anaf [513];
  pt_prj_t_conflict4 precomp [16];
  undefined1 local_1b88 [16];
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [16];
  undefined1 local_1b58 [16];
  undefined1 local_1b48 [16];
  uint64_t local_1b38 [10];
  undefined1 local_1ae8 [16];
  undefined1 local_1ad8 [16];
  undefined1 local_1ac8 [16];
  undefined1 local_1ab8 [16];
  undefined1 local_1aa8 [16];
  uint64_t local_1a98 [10];
  uint8_t local_1a48 [64];
  uint8_t local_1a08 [64];
  uchar local_19c8 [64];
  uchar local_1988 [64];
  pt_aff_t_conflict4 local_1948;
  byte local_1858 [528];
  byte local_1648 [528];
  pt_prj_t_conflict4 local_1438 [16];
  
  bVar19 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  pBVar7 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar5 = 0;
  if (((((pBVar7 != (BIGNUM *)0x0) &&
        (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar6,pBVar7,ctx), iVar5 = iVar4,
        iVar3 != 0)) && (iVar4 = BN_bn2lebinpad(pBVar6,local_1a08,0x40), iVar4 == 0x40)) &&
      ((iVar4 = BN_bn2lebinpad(pBVar7,local_1a48,0x40), iVar4 == 0x40 &&
       (iVar4 = BN_bn2lebinpad(n,local_1988,0x40), iVar4 == 0x40)))) &&
     (iVar4 = BN_bn2lebinpad(m,local_19c8,0x40), iVar4 == 0x40)) {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1948.X,local_1a08);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1948.Y,local_1a48);
    bVar16 = 0;
    memset(local_1648,0,0x201);
    memset(local_1858,0,0x201);
    memset((pt_prj_t_conflict4 *)local_1b88,0,0x140);
    precomp_wnaf(local_1438,&local_1948);
    scalar_wnaf((int8_t *)local_1648,local_1988);
    scalar_wnaf((int8_t *)local_1858,local_19c8);
    bVar2 = true;
    lVar17 = 0x200;
    do {
      if (!bVar2) {
        point_double((pt_prj_t_conflict4 *)local_1b88,(pt_prj_t_conflict4 *)local_1b88);
      }
      bVar1 = local_1858[lVar17];
      if (bVar1 != 0) {
        if (bVar16 != bVar1 >> 7) {
          local_1b88._8_8_ = 0xffffffffffffe - local_1b88._8_8_;
          local_1b88._0_8_ = 0x1ffffffffffb8e - local_1b88._0_8_;
          local_1b78._8_8_ = 0xffffffffffffe - local_1b78._8_8_;
          local_1b78._0_8_ = 0xffffffffffffe - local_1b78._0_8_;
          local_1b68._8_8_ = 0x1ffffffffffffe - local_1b68._8_8_;
          local_1b68._0_8_ = 0xffffffffffffe - local_1b68._0_8_;
          local_1b58._8_8_ = 0xffffffffffffe - local_1b58._8_8_;
          local_1b58._0_8_ = 0xffffffffffffe - local_1b58._0_8_;
          local_1b48._8_8_ = 0xffffffffffffe - local_1b48._8_8_;
          local_1b48._0_8_ = 0xffffffffffffe - local_1b48._0_8_;
          local_1ae8._8_8_ = 0xffffffffffffe - local_1ae8._8_8_;
          local_1ae8._0_8_ = 0x1ffffffffffb8e - local_1ae8._0_8_;
          local_1ad8._8_8_ = 0xffffffffffffe - local_1ad8._8_8_;
          local_1ad8._0_8_ = 0xffffffffffffe - local_1ad8._0_8_;
          local_1ac8._8_8_ = 0x1ffffffffffffe - local_1ac8._8_8_;
          local_1ac8._0_8_ = 0xffffffffffffe - local_1ac8._0_8_;
          local_1ab8._8_8_ = 0xffffffffffffe - local_1ab8._8_8_;
          local_1ab8._0_8_ = 0xffffffffffffe - local_1ab8._0_8_;
          local_1aa8._8_8_ = 0xffffffffffffe - local_1aa8._8_8_;
          local_1aa8._0_8_ = 0xffffffffffffe - local_1aa8._0_8_;
          bVar16 = bVar16 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar9 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          ppVar10 = local_1438 + (int)uVar9;
          ppVar14 = (pt_prj_t_conflict4 *)local_1b88;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            ppVar14->X[0] = ppVar10->X[0];
            ppVar10 = (pt_prj_t_conflict4 *)((long)ppVar10 + (ulong)bVar19 * -0x10 + 8);
            ppVar14 = (pt_prj_t_conflict4 *)((long)ppVar14 + (ulong)bVar19 * -0x10 + 8);
          }
          puVar11 = local_1438[(int)uVar9].Y;
          puVar15 = local_1b38;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          puVar11 = local_1438[(int)uVar9].T;
          puVar15 = (uint64_t *)local_1ae8;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          puVar11 = local_1438[(int)uVar9].Z;
          puVar15 = local_1a98;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
        }
        else {
          point_add_proj((pt_prj_t_conflict4 *)local_1b88,(pt_prj_t_conflict4 *)local_1b88,
                         local_1438 + (int)uVar9);
        }
        bVar2 = false;
      }
      bVar1 = local_1648[lVar17];
      if (bVar1 != 0) {
        if (bVar16 != bVar1 >> 7) {
          local_1b88._8_8_ = 0xffffffffffffe - local_1b88._8_8_;
          local_1b88._0_8_ = 0x1ffffffffffb8e - local_1b88._0_8_;
          local_1b78._8_8_ = 0xffffffffffffe - local_1b78._8_8_;
          local_1b78._0_8_ = 0xffffffffffffe - local_1b78._0_8_;
          local_1b68._8_8_ = 0x1ffffffffffffe - local_1b68._8_8_;
          local_1b68._0_8_ = 0xffffffffffffe - local_1b68._0_8_;
          local_1b58._8_8_ = 0xffffffffffffe - local_1b58._8_8_;
          local_1b58._0_8_ = 0xffffffffffffe - local_1b58._0_8_;
          local_1b48._8_8_ = 0xffffffffffffe - local_1b48._8_8_;
          local_1b48._0_8_ = 0xffffffffffffe - local_1b48._0_8_;
          local_1ae8._8_8_ = 0xffffffffffffe - local_1ae8._8_8_;
          local_1ae8._0_8_ = 0x1ffffffffffb8e - local_1ae8._0_8_;
          local_1ad8._8_8_ = 0xffffffffffffe - local_1ad8._8_8_;
          local_1ad8._0_8_ = 0xffffffffffffe - local_1ad8._0_8_;
          local_1ac8._8_8_ = 0x1ffffffffffffe - local_1ac8._8_8_;
          local_1ac8._0_8_ = 0xffffffffffffe - local_1ac8._0_8_;
          local_1ab8._8_8_ = 0xffffffffffffe - local_1ab8._8_8_;
          local_1ab8._0_8_ = 0xffffffffffffe - local_1ab8._0_8_;
          local_1aa8._8_8_ = 0xffffffffffffe - local_1aa8._8_8_;
          local_1aa8._0_8_ = 0xffffffffffffe - local_1aa8._0_8_;
          bVar16 = bVar16 ^ 1;
        }
        uVar9 = (int)((int)(char)bVar1 - 1U) >> 1;
        if ((char)bVar1 < '\0') {
          uVar9 = (uint)~(int)(char)bVar1 >> 1;
        }
        if (bVar2) {
          ppVar12 = lut_cmb[0] + (int)uVar9;
          ppVar10 = (pt_prj_t_conflict4 *)local_1b88;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            ppVar10->X[0] = ppVar12->X[0];
            ppVar12 = (pt_aff_t_conflict4 *)((long)ppVar12 + (ulong)bVar19 * -0x10 + 8);
            ppVar10 = (pt_prj_t_conflict4 *)((long)ppVar10 + (ulong)bVar19 * -0x10 + 8);
          }
          puVar11 = lut_cmb[0][(int)uVar9].Y;
          puVar15 = local_1b38;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          puVar11 = lut_cmb[0][(int)uVar9].T;
          puVar15 = (uint64_t *)local_1ae8;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = *puVar11;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar19 * -2 + 1;
          }
          plVar13 = const_one;
          puVar11 = local_1a98;
          for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar11 = *plVar13;
            plVar13 = plVar13 + (ulong)bVar19 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
          }
        }
        else {
          point_add_mixed((pt_prj_t_conflict4 *)local_1b88,(pt_prj_t_conflict4 *)local_1b88,
                          lut_cmb[0] + (int)uVar9);
        }
        bVar2 = false;
      }
      bVar18 = lVar17 != 0;
      lVar17 = lVar17 + -1;
    } while (bVar18);
    if (bVar2) {
      local_1b48 = (undefined1  [16])0x0;
      local_1b58 = (undefined1  [16])0x0;
      local_1b68 = (undefined1  [16])0x0;
      local_1b78 = (undefined1  [16])0x0;
      local_1b88 = (undefined1  [16])0x0;
      plVar13 = const_one;
      puVar11 = local_1b38;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar11 = *plVar13;
        plVar13 = plVar13 + (ulong)bVar19 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
      }
      local_1aa8 = (undefined1  [16])0x0;
      local_1ab8 = (undefined1  [16])0x0;
      local_1ac8 = (undefined1  [16])0x0;
      local_1ad8 = (undefined1  [16])0x0;
      local_1ae8 = (undefined1  [16])0x0;
      plVar13 = const_one;
      puVar11 = local_1a98;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar11 = *plVar13;
        plVar13 = plVar13 + (ulong)bVar19 * -2 + 1;
        puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
      }
    }
    if (bVar16 != 0) {
      local_1b88._8_8_ = 0xffffffffffffe - local_1b88._8_8_;
      local_1b88._0_8_ = 0x1ffffffffffb8e - local_1b88._0_8_;
      local_1b78._8_8_ = 0xffffffffffffe - local_1b78._8_8_;
      local_1b78._0_8_ = 0xffffffffffffe - local_1b78._0_8_;
      local_1b68._8_8_ = 0x1ffffffffffffe - local_1b68._8_8_;
      local_1b68._0_8_ = 0xffffffffffffe - local_1b68._0_8_;
      local_1b58._8_8_ = 0xffffffffffffe - local_1b58._8_8_;
      local_1b58._0_8_ = 0xffffffffffffe - local_1b58._0_8_;
      local_1b48._8_8_ = 0xffffffffffffe - local_1b48._8_8_;
      local_1b48._0_8_ = 0xffffffffffffe - local_1b48._0_8_;
      local_1ae8._8_8_ = 0xffffffffffffe - local_1ae8._8_8_;
      local_1ae8._0_8_ = 0x1ffffffffffb8e - local_1ae8._0_8_;
      local_1ad8._8_8_ = 0xffffffffffffe - local_1ad8._8_8_;
      local_1ad8._0_8_ = 0xffffffffffffe - local_1ad8._0_8_;
      local_1ac8._8_8_ = 0x1ffffffffffffe - local_1ac8._8_8_;
      local_1ac8._0_8_ = 0xffffffffffffe - local_1ac8._0_8_;
      local_1ab8._8_8_ = 0xffffffffffffe - local_1ab8._8_8_;
      local_1ab8._0_8_ = 0xffffffffffffe - local_1ab8._0_8_;
      local_1aa8._8_8_ = 0xffffffffffffe - local_1aa8._8_8_;
      local_1aa8._0_8_ = 0xffffffffffffe - local_1aa8._0_8_;
    }
    point_edwards2legacy((pt_prj_t_conflict4 *)local_1b88,(pt_prj_t_conflict4 *)local_1b88);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(local_1a98,local_1a98);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
              (local_1948.X,(uint64_t *)local_1b88,local_1a98);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1948.Y,local_1b38,local_1a98);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(local_1a08,local_1948.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(local_1a48,local_1948.Y);
    iVar5 = CRYPTO_memcmp("",local_1a08,0x40);
    if ((iVar5 == 0) && (iVar5 = CRYPTO_memcmp("",local_1a48,0x40), iVar5 == 0)) {
      iVar5 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar5 == 0) {
        iVar5 = 0;
        goto LAB_00122a11;
      }
    }
    else {
      lVar17 = BN_lebin2bn(local_1a08,0x40,pBVar6);
      iVar5 = 0;
      if ((lVar17 == 0) ||
         ((lVar17 = BN_lebin2bn(local_1a48,0x40,pBVar7), lVar17 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar6,pBVar7,ctx), iVar4 == 0))))
      goto LAB_00122a11;
    }
    iVar5 = 1;
  }
LAB_00122a11:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar5;
}

Assistant:

int
    point_mul_two_id_tc26_gost_3410_2012_512_paramSetC(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(n, b_n, 64) != 64 || BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}